

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

bool __thiscall glcts::LayoutBindingBaseCase::needsPrecision(LayoutBindingBaseCase *this)

{
  eSurfaceType eVar1;
  byte bVar2;
  uint uVar3;
  
  uVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  eVar1 = (this->m_testParams).surface_type;
  if (((uVar3 & 0x300) == 0) || (this->m_glslVersion == GLSL_VERSION_450)) {
    bVar2 = eVar1 + ~ShaderStorageBuffer < 0xfffffffe;
  }
  else {
    bVar2 = 1;
    if (eVar1 < (ShaderStorageBuffer|Texture)) {
      bVar2 = 2 >> ((byte)eVar1 & 0x1f);
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool needsPrecision() const
	{
		if (isContextTypeES(m_context.getRenderContext().getType()) || m_glslVersion == glu::GLSL_VERSION_450)
		{
			return (m_testParams.surface_type != UniformBlock) && (m_testParams.surface_type != ShaderStorageBuffer);
		}
		else
		{
			return (m_testParams.surface_type != UniformBlock) && (m_testParams.surface_type != ShaderStorageBuffer) &&
				   (m_testParams.surface_type != AtomicCounter) && (m_testParams.surface_type != Image);
		}
	}